

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_rawgetp(lua_State *L,int idx,void *p)

{
  StkId pTVar1;
  int iVar2;
  TValue *pTVar3;
  TValue *io2;
  TValue *io1;
  TValue *io;
  TValue k;
  StkId t;
  void *p_local;
  int idx_local;
  lua_State *L_local;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x315,"int lua_rawgetp(lua_State *, int, const void *)");
  }
  k._8_8_ = index2addr(L,idx);
  if (((TValue *)k._8_8_)->tt_ != 0x8005) {
    __assert_fail("(((((t))->tt_) == (((5) | (1 << 15))))) && \"Lua table expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x317,"int lua_rawgetp(lua_State *, int, const void *)");
  }
  k.value_.b._0_2_ = 2;
  pTVar1 = L->top;
  io = (TValue *)p;
  if (((TValue *)k._8_8_)->tt_ != 0x8005) {
    __assert_fail("((((t))->tt_) == (((5) | (1 << 15))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x319,"int lua_rawgetp(lua_State *, int, const void *)");
  }
  if (((((TValue *)k._8_8_)->value_).gc)->tt != '\x05') {
    __assert_fail("(((t)->value_).gc)->tt == 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x319,"int lua_rawgetp(lua_State *, int, const void *)");
  }
  pTVar3 = luaH_get((Table *)(((TValue *)k._8_8_)->value_).gc,(TValue *)&io);
  pTVar1->value_ = pTVar3->value_;
  pTVar1->tt_ = pTVar3->tt_;
  if ((pTVar1->tt_ & 0x8000) != 0) {
    if ((pTVar1->tt_ & 0x8000) == 0) {
      __assert_fail("(((io1)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x319,"int lua_rawgetp(lua_State *, int, const void *)");
    }
    if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_00118824:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x319,"int lua_rawgetp(lua_State *, int, const void *)");
    }
    if (L != (lua_State *)0x0) {
      if ((pTVar1->tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x319,"int lua_rawgetp(lua_State *, int, const void *)");
      }
      if ((((pTVar1->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00118824;
    }
  }
  L->top = L->top + 1;
  if (L->ci->top < L->top) {
    __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x31a,"int lua_rawgetp(lua_State *, int, const void *)");
  }
  iVar2 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar2;
  if (iVar2 != 0) {
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x31b,"int lua_rawgetp(lua_State *, int, const void *)");
  }
  return L->top[-1].tt_ & 0xf;
}

Assistant:

LUA_API int lua_rawgetp (lua_State *L, int idx, const void *p) {
  StkId t;
  TValue k;
  lua_lock(L);
  t = index2addr(L, idx);
  api_check(L, ttisLtable(t), "Lua table expected");
  setpvalue(&k, cast(void *, p));
  setobj2s(L, L->top, luaH_get(hvalue(t), &k));
  api_incr_top(L);
  lua_unlock(L);
  return ttnov(L->top - 1);
}